

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  pointer pcVar1;
  
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_0014c068;
  (this->m_wildcardPattern)._vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_0014c040;
  pcVar1 = (this->m_wildcardPattern).m_pattern._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_wildcardPattern).m_pattern.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}